

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  StringPiece *this_00;
  bool bVar1;
  int iVar2;
  const_pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  ostream *poVar6;
  int local_384;
  LogMessage local_370;
  undefined1 local_1f0 [8];
  StringPiece snip;
  LogMessage local_1d0;
  int local_50;
  int local_4c;
  int n;
  int c;
  char *end;
  char *s;
  StringPiece *pSStack_30;
  int veclen_local;
  StringPiece *vec_local;
  StringPiece *rewrite_local;
  string *out_local;
  RE2 *this_local;
  
  s._4_4_ = veclen;
  pSStack_30 = vec;
  vec_local = rewrite;
  rewrite_local = (StringPiece *)out;
  out_local = (string *)this;
  pcVar3 = StringPiece::data(rewrite);
  end = pcVar3;
  sVar4 = StringPiece::size(vec_local);
  _n = pcVar3 + sVar4;
  do {
    if (_n <= end) {
      return true;
    }
    if (*end == '\\') {
      end = end + 1;
      if (end < _n) {
        local_384 = (int)*end;
      }
      else {
        local_384 = -1;
      }
      local_4c = local_384;
      iVar2 = isdigit(local_384);
      if (iVar2 == 0) {
        if (local_4c != 0x5c) {
          bVar1 = Options::log_errors(&this->options_);
          if (bVar1) {
            LogMessage::LogMessage
                      (&local_370,
                       "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/re2.cc"
                       ,0x423);
            poVar5 = LogMessage::stream(&local_370);
            poVar6 = std::operator<<((ostream *)poVar5,"invalid rewrite pattern: ");
            pcVar3 = StringPiece::data(vec_local);
            std::operator<<(poVar6,pcVar3);
            LogMessage::~LogMessage(&local_370);
          }
          return false;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rewrite_local
                  ,'\\');
      }
      else {
        local_50 = local_4c + -0x30;
        if (s._4_4_ <= local_50) {
          bVar1 = Options::log_errors(&this->options_);
          if (bVar1) {
            LogMessage::LogMessage
                      (&local_1d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/re2.cc"
                       ,0x417);
            poVar5 = LogMessage::stream(&local_1d0);
            poVar6 = std::operator<<((ostream *)poVar5,"invalid substitution \\");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_50);
            poVar6 = std::operator<<(poVar6," from ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,s._4_4_);
            std::operator<<(poVar6," groups");
            LogMessage::~LogMessage(&local_1d0);
          }
          return false;
        }
        local_1f0 = (undefined1  [8])pSStack_30[local_50].data_;
        snip.data_ = (const_pointer)pSStack_30[local_50].size_;
        bVar1 = StringPiece::empty((StringPiece *)local_1f0);
        this_00 = rewrite_local;
        if (!bVar1) {
          pcVar3 = StringPiece::data((StringPiece *)local_1f0);
          sVar4 = StringPiece::size((StringPiece *)local_1f0);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,pcVar3
                 ,sVar4);
        }
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rewrite_local,
                *end);
    }
    end = end + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "invalid substitution \\" << n
                     << " from " << veclen << " groups";
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (!snip.empty())
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}